

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::RepeatedMessage::GeneratePrivateMembers
          (RepeatedMessage *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    pcVar2 = "\n      $pbi$::RawPtr<$pb$::$Weak$RepeatedPtrField<$Submsg$>> $name$_;\n    ";
    uVar1 = 0x4a;
  }
  else {
    pcVar2 = "$pb$::$Weak$RepeatedPtrField< $Submsg$ > $name$_;\n";
    uVar1 = 0x32;
  }
  google::protobuf::io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void RepeatedMessage::GeneratePrivateMembers(io::Printer* p) const {
  if (should_split()) {
    p->Emit(R"cc(
      $pbi$::RawPtr<$pb$::$Weak$RepeatedPtrField<$Submsg$>> $name$_;
    )cc");
  } else {
    p->Emit("$pb$::$Weak$RepeatedPtrField< $Submsg$ > $name$_;\n");
  }
}